

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<nonstd::optional_bare::optional<long>,nonstd::optional_bare::optional<int>>
          (lest *this,optional<long> *lhs,string *op,optional<int> *rhs)

{
  ostream *poVar1;
  string local_210 [32];
  lest local_1f0 [48];
  lest local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream os;
  optional<int> *rhs_local;
  string *op_local;
  optional<long> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<nonstd::optional_bare::optional<long>>(local_1c0,lhs);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)op);
  poVar1 = std::operator<<(poVar1," ");
  to_string<nonstd::optional_bare::optional<int>>(local_1f0,rhs);
  std::operator<<(poVar1,(string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return this;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}